

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O0

void __thiscall
libtorrent::anon_unknown_6::ut_pex_peer_plugin::ut_pex_peer_plugin
          (ut_pex_peer_plugin *this,torrent *t,peer_connection *pc,ut_pex_plugin *tp)

{
  time_point tVar1;
  time_point *local_50;
  int local_3c;
  int i;
  int num_pex_timers;
  ut_pex_plugin *tp_local;
  peer_connection *pc_local;
  torrent *t_local;
  ut_pex_peer_plugin *this_local;
  
  libtorrent::aux::ut_pex_peer_store::ut_pex_peer_store(&this->super_ut_pex_peer_store);
  peer_plugin::peer_plugin(&this->super_peer_plugin);
  (this->super_ut_pex_peer_store)._vptr_ut_pex_peer_store =
       (_func_int **)&PTR__ut_pex_peer_plugin_00b94de8;
  (this->super_peer_plugin)._vptr_peer_plugin = (_func_int **)&PTR__ut_pex_peer_plugin_00b94e28;
  this->m_torrent = t;
  this->m_pc = pc;
  this->m_tp = tp;
  local_50 = this->m_last_pex;
  do {
    ::std::chrono::
    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(local_50);
    local_50 = local_50 + 1;
  } while (local_50 != &this->m_last_msg);
  tVar1 = min_time();
  (this->m_last_msg).__d.__r = (rep)tVar1.__d.__r;
  this->m_message_index = 0;
  this->m_first_time = true;
  for (local_3c = 0; local_3c < 6; local_3c = local_3c + 1) {
    tVar1 = min_time();
    this->m_last_pex[local_3c].__d.__r = (rep)tVar1.__d.__r;
  }
  return;
}

Assistant:

ut_pex_peer_plugin(aux::torrent& t, aux::peer_connection& pc, ut_pex_plugin& tp)
			: m_torrent(t)
			, m_pc(pc)
			, m_tp(tp)
			, m_last_msg(min_time())
			, m_message_index(0)
			, m_first_time(true)
		{
			const int num_pex_timers = sizeof(m_last_pex) / sizeof(m_last_pex[0]);
			for (int i = 0; i < num_pex_timers; ++i)
			{
				m_last_pex[i] = min_time();
			}
		}